

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O0

int Hop_ObjFanoutCount_rec(Hop_Obj_t *pObj,Hop_Obj_t *pPivot)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Hop_Obj_t *pHVar4;
  int Counter;
  Hop_Obj_t *pPivot_local;
  Hop_Obj_t *pObj_local;
  
  iVar1 = Hop_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopDfs.c"
                  ,0x12d,"int Hop_ObjFanoutCount_rec(Hop_Obj_t *, Hop_Obj_t *)");
  }
  iVar1 = Hop_ObjIsNode(pObj);
  if ((iVar1 != 0) && (iVar1 = Hop_ObjIsMarkA(pObj), iVar1 == 0)) {
    pHVar4 = Hop_ObjFanin0(pObj);
    iVar1 = Hop_ObjFanoutCount_rec(pHVar4,pPivot);
    pHVar4 = Hop_ObjFanin1(pObj);
    iVar2 = Hop_ObjFanoutCount_rec(pHVar4,pPivot);
    iVar3 = Hop_ObjIsMarkA(pObj);
    if (iVar3 == 0) {
      Hop_ObjSetMarkA(pObj);
      return iVar1 + iVar2;
    }
    __assert_fail("!Hop_ObjIsMarkA(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopDfs.c"
                  ,0x132,"int Hop_ObjFanoutCount_rec(Hop_Obj_t *, Hop_Obj_t *)");
  }
  return (uint)(pObj == pPivot);
}

Assistant:

int Hop_ObjFanoutCount_rec( Hop_Obj_t * pObj, Hop_Obj_t * pPivot )
{
    int Counter;
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) || Hop_ObjIsMarkA(pObj) )
        return (int)(pObj == pPivot);
    Counter = Hop_ObjFanoutCount_rec( Hop_ObjFanin0(pObj), pPivot ) + 
              Hop_ObjFanoutCount_rec( Hop_ObjFanin1(pObj), pPivot );
    assert( !Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjSetMarkA( pObj );
    return Counter;
}